

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

RPCHelpMan * wallet::bumpfee(void)

{
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<char> local_39;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"bumpfee",&local_39);
  bumpfee_helper(in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan bumpfee() { return bumpfee_helper("bumpfee"); }